

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_grouping(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node_grp **groupings)

{
  lysp_ext_instance **exts;
  lysp_node **siblings;
  ly_stmt stmt_00;
  lysp_node_grp *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  lysp_node_grp *parent_00;
  lysp_node_grp *plVar4;
  char *format;
  uint32_t substmt_index;
  ly_ctx *plVar5;
  char *pcVar6;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    parent_00 = (lysp_node_grp *)calloc(1,0x68);
    if (parent_00 == (lysp_node_grp *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = LY_EMEM;
      ly_log(plVar5,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_grouping");
    }
    else {
      plVar1 = *groupings;
      if (*groupings == (lysp_node_grp *)0x0) {
        *groupings = parent_00;
      }
      else {
        do {
          plVar4 = plVar1;
          plVar1 = (lysp_node_grp *)(plVar4->field_0).node.next;
        } while (plVar1 != (lysp_node_grp *)0x0);
        (plVar4->field_0).field_1.next = parent_00;
      }
    }
    if (parent_00 != (lysp_node_grp *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar5,stmt->arg,0,&(parent_00->field_0).node.name);
      if (LVar3 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = 0x4000;
        (parent_00->field_0).node.parent = parent;
        stmt_01 = stmt->child;
        LVar3 = LY_SUCCESS;
        if (stmt_01 != (lysp_stmt *)0x0) {
          exts = &(parent_00->field_0).node.exts;
          siblings = &parent_00->child;
          do {
            stmt_00 = stmt_01->kw;
            if ((int)stmt_00 < 0x2000) {
              if ((int)stmt_00 < 0x200) {
                if ((int)stmt_00 < 0x20) {
                  if (stmt_00 == LY_STMT_NOTIFICATION) {
                    plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (*(byte *)&plVar2[2].schema < 2) {
                      if (ctx == (lysp_ctx *)0x0) {
                        plVar5 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar5 = (ly_ctx *)**(undefined8 **)plVar2;
                      }
                      pcVar6 = "notification";
LAB_0016c8aa:
                      format = 
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ;
                      goto LAB_0016c8b8;
                    }
                    LVar3 = lysp_stmt_notif(ctx,stmt_01,(lysp_node *)parent_00,&parent_00->notifs);
                  }
                  else {
                    if (stmt_00 != LY_STMT_ACTION) goto LAB_0016c80d;
                    plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (*(byte *)&plVar2[2].schema < 2) {
                      if (ctx == (lysp_ctx *)0x0) {
                        plVar5 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar5 = (ly_ctx *)**(undefined8 **)plVar2;
                      }
                      pcVar6 = "action";
                      goto LAB_0016c8aa;
                    }
                    LVar3 = lysp_stmt_action(ctx,stmt_01,(lysp_node *)parent_00,&parent_00->actions)
                    ;
                  }
                }
                else {
                  if (stmt_00 == LY_STMT_ANYDATA) {
                    plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (*(byte *)&plVar2[2].schema < 2) {
                      if (ctx == (lysp_ctx *)0x0) {
                        plVar5 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar5 = (ly_ctx *)**(undefined8 **)plVar2;
                      }
                      pcVar6 = "anydata";
                      goto LAB_0016c8aa;
                    }
                  }
                  else if (stmt_00 != LY_STMT_ANYXML) goto LAB_0016c80d;
                  LVar3 = lysp_stmt_any(ctx,stmt_01,(lysp_node *)parent_00,siblings);
                }
              }
              else if ((int)stmt_00 < 0x800) {
                if (stmt_00 == LY_STMT_CHOICE) {
                  LVar3 = lysp_stmt_choice(ctx,stmt_01,(lysp_node *)parent_00,siblings);
                }
                else {
                  if (stmt_00 != LY_STMT_CONTAINER) goto LAB_0016c80d;
                  LVar3 = lysp_stmt_container(ctx,stmt_01,(lysp_node *)parent_00,siblings);
                }
              }
              else if (stmt_00 == LY_STMT_GROUPING) {
                LVar3 = lysp_stmt_grouping(ctx,stmt_01,(lysp_node *)parent_00,&parent_00->groupings)
                ;
              }
              else {
                if (stmt_00 != LY_STMT_LEAF) goto LAB_0016c80d;
                LVar3 = lysp_stmt_leaf(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
            }
            else if ((int)stmt_00 < 0xf0000) {
              if ((int)stmt_00 < 0x8000) {
                if (stmt_00 == LY_STMT_LEAF_LIST) {
                  LVar3 = lysp_stmt_leaflist(ctx,stmt_01,(lysp_node *)parent_00,siblings);
                }
                else {
                  if (stmt_00 != LY_STMT_LIST) goto LAB_0016c80d;
                  LVar3 = lysp_stmt_list(ctx,stmt_01,(lysp_node *)parent_00,siblings);
                }
              }
              else if (stmt_00 == LY_STMT_USES) {
                LVar3 = lysp_stmt_uses(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
              else {
                substmt_index = (int)parent_00 + 0x20;
                if (stmt_00 != LY_STMT_DESCRIPTION) goto LAB_0016c80d;
LAB_0016c695:
                LVar3 = lysp_stmt_text_field
                                  (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
              }
            }
            else if ((int)stmt_00 < 0x2c0000) {
              if (stmt_00 != LY_STMT_EXTENSION_INSTANCE) {
                substmt_index = (int)parent_00 + 0x28;
                if (stmt_00 == LY_STMT_REFERENCE) goto LAB_0016c695;
LAB_0016c80d:
                if (ctx == (lysp_ctx *)0x0) {
                  plVar5 = (ly_ctx *)0x0;
                }
                else {
                  plVar5 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar6 = lyplg_ext_stmt2str(stmt_00);
                format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0016c8b8:
                ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"grouping");
                return LY_EVALID;
              }
              LVar3 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_GROUPING,0,exts);
            }
            else if (stmt_00 == LY_STMT_STATUS) {
              LVar3 = lysp_stmt_status(ctx,stmt_01,&(parent_00->field_0).node.flags,exts);
            }
            else {
              if (stmt_00 != LY_STMT_TYPEDEF) goto LAB_0016c80d;
              LVar3 = lysp_stmt_typedef(ctx,stmt_01,(lysp_node *)parent_00,&parent_00->typedefs);
            }
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            stmt_01 = stmt_01->next;
            LVar3 = LY_SUCCESS;
          } while (stmt_01 != (lysp_stmt *)0x0);
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_grouping(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node_grp **groupings)
{
    struct lysp_node_grp *grp;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    LY_LIST_NEW_RET(PARSER_CTX(ctx), groupings, grp, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &grp->name));
    grp->nodetype = LYS_GROUPING;
    grp->parent = parent;

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &grp->dsc, Y_STR_ARG, &grp->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &grp->ref, Y_STR_ARG, &grp->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &grp->flags, &grp->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "grouping");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &grp->node, &grp->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(lysp_stmt_choice(ctx, child, &grp->node, &grp->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &grp->node, &grp->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &grp->node, &grp->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &grp->node, &grp->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &grp->node, &grp->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(lysp_stmt_uses(ctx, child, &grp->node, &grp->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(lysp_stmt_typedef(ctx, child, &grp->node, &grp->typedefs));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "grouping");
            LY_CHECK_RET(lysp_stmt_action(ctx, child, &grp->node, &grp->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(lysp_stmt_grouping(ctx, child, &grp->node, &grp->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "grouping");
            LY_CHECK_RET(lysp_stmt_notif(ctx, child, &grp->node, &grp->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_GROUPING, 0, &grp->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "grouping");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}